

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
         *this)

{
  FloatFormat *pFVar1;
  double *pdVar2;
  _Rb_tree_header *p_Var3;
  Precision PVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar5;
  TestLog *pTVar6;
  Statement *pSVar7;
  ShaderExecutor *pSVar8;
  bool bVar9;
  int iVar10;
  MessageBuilder *this_01;
  _Base_ptr p_Var11;
  IVal *pIVar12;
  IVal *pIVar13;
  TestStatus *__return_storage_ptr___00;
  ostringstream *this_02;
  bool bVar14;
  deUint32 in_stack_fffffffffffff9c8;
  long lVar15;
  int numErrors;
  size_t local_610;
  TestStatus *local_608;
  FloatFormat *local_600;
  IVal in2;
  FloatFormat highpFmt;
  size_t local_5b0;
  IVal in3;
  void *outputArr [2];
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  outputs;
  void *inputArr [4];
  IVal in1;
  IVal in0;
  FuncSet funcs;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  ResultCollector status;
  ostringstream oss;
  
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar4 = (this->m_caseCtx).precision;
  sVar5 = (this->m_caseCtx).numRandoms;
  local_608 = __return_storage_ptr__;
  iVar10 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_600 = pFVar1;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,3,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&inputs,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar4,(Precision)sVar5,(ulong)(iVar10 + 0xdeadbeef),
             in_stack_fffffffffffff9c8);
  local_610 = ((long)inputs.in0.
                     super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)inputs.in0.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>::
  Outputs(&outputs,local_610);
  highpFmt.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  highpFmt.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  highpFmt.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  highpFmt.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  highpFmt.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  highpFmt.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  highpFmt.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  highpFmt.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  highpFmt._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  numErrors = 0;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &env.m_map._M_t._M_impl.super__Rb_tree_header._M_header;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&status);
  pTVar6 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  inputArr[0] = inputs.in0.
                super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  inputArr[1] = inputs.in1.
                super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  inputArr[2] = inputs.in2.
                super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  inputArr[3] = inputs.in3.
                super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  outputArr[0] = outputs.out0.
                 super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  outputArr[1] = outputs.out1.
                 super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
  in0.m_data.m_data[0].m_data[0]._0_8_ = pTVar6;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::operator<<((ostream *)pdVar2,"Statement: ");
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)&in0,&this->m_stmt);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  p_Var3 = &funcs._M_t._M_impl.super__Rb_tree_header;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  funcs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (*pSVar7->_vptr_Statement[4])(pSVar7,&funcs);
  for (p_Var11 = funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var11 != p_Var3; p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
    (**(code **)(**(long **)(p_Var11 + 1) + 0x30))(*(long **)(p_Var11 + 1),&oss);
  }
  if (funcs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
    in0.m_data.m_data[0].m_data[0]._0_8_ = pTVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)pdVar2,(string *)&in1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&in0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&in1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree(&funcs._M_t);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  pSVar8 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  pIVar12 = (IVal *)outputArr;
  (*pSVar8->_vptr_ShaderExecutor[2])(pSVar8,local_610,inputArr,pIVar12,0);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix(&in0);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)&oss);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)&funcs);
  Environment::bind<tcu::Matrix<float,3,2>>
            (&env,(this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.
                  m_ptr,&in0);
  Environment::bind<vkt::shaderexecutor::Void>
            (&env,(this->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_ptr,&in1);
  Environment::bind<vkt::shaderexecutor::Void>
            (&env,(this->m_variables).in2.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_ptr,&in2);
  Environment::bind<vkt::shaderexecutor::Void>
            (&env,(this->m_variables).in3.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_ptr,&in3);
  Environment::bind<tcu::Matrix<float,3,2>>
            (&env,(this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.
                  m_ptr,(IVal *)&oss);
  Environment::bind<tcu::Matrix<float,3,2>>
            (&env,(this->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>.
                  m_ptr,(IVal *)&funcs);
  lVar15 = 0;
  local_5b0 = local_610;
  iVar10 = 0;
  while( true ) {
    bVar14 = local_5b0 == 0;
    local_5b0 = local_5b0 - 1;
    if (bVar14) break;
    tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)&oss);
    tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)&funcs);
    pFVar1 = local_600;
    round<tcu::Matrix<float,3,2>>
              ((IVal *)&in1,(shaderexecutor *)local_600,
               (FloatFormat *)
               ((long)((inputs.in0.
                        super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
               lVar15),(Matrix<float,_3,_2> *)pIVar12);
    ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
              (&in0,pFVar1,(IVal *)&in1);
    pIVar12 = Environment::lookup<tcu::Matrix<float,3,2>>
                        (&env,(this->m_variables).in0.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                              .m_ptr);
    tcu::Matrix<tcu::Interval,_3,_2>::operator=(pIVar12,(Matrix<tcu::Interval,_3,_2> *)&in0);
    Environment::lookup<vkt::shaderexecutor::Void>
              (&env,(this->m_variables).in1.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                    .m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              (&env,(this->m_variables).in2.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                    .m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              (&env,(this->m_variables).in3.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                    .m_ptr);
    in0.m_data.m_data[0].m_data[1].m_hi._0_4_ = (this->m_caseCtx).precision;
    pIVar12 = (IVal *)local_600->m_maxValue;
    in0.m_data.m_data[0].m_data[0]._0_8_ = *(undefined8 *)local_600;
    in0.m_data.m_data[0].m_data[0].m_lo._0_4_ = local_600->m_fractionBits;
    in0.m_data.m_data[0].m_data[0].m_lo._4_4_ = local_600->m_hasSubnormal;
    in0.m_data.m_data[0].m_data[0].m_hi._0_4_ = local_600->m_hasInf;
    in0.m_data.m_data[0].m_data[0].m_hi._4_4_ = local_600->m_hasNaN;
    in0.m_data.m_data[0].m_data[1].m_hasNaN = local_600->m_exactPrecision;
    in0.m_data.m_data[0].m_data[1]._1_3_ = *(undefined3 *)&local_600->field_0x19;
    in0.m_data.m_data[0].m_data[1]._4_4_ = *(undefined4 *)&local_600->field_0x1c;
    in0.m_data.m_data[0].m_data[2].m_lo._0_4_ = 0;
    pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    in0.m_data.m_data[0].m_data[1].m_lo = (double)pIVar12;
    in0.m_data.m_data[0].m_data[2]._0_8_ = &env;
    (*pSVar7->_vptr_Statement[3])(pSVar7,(MessageBuilder *)&in0);
    pIVar13 = Environment::lookup<tcu::Matrix<float,3,2>>
                        (&env,(this->m_variables).out1.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                              .m_ptr);
    ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
              (&in0,&highpFmt,pIVar13);
    tcu::Matrix<tcu::Interval,_3,_2>::operator=
              ((Matrix<tcu::Interval,_3,_2> *)&funcs,(Matrix<tcu::Interval,_3,_2> *)&in0);
    bVar14 = ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::
             doContains((Matrix<tcu::Interval,_3,_2> *)&funcs,
                        (Matrix<float,_3,_2> *)
                        ((long)((outputs.out1.
                                 super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                               m_data + lVar15));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&in0,"Shader output 1 is outside acceptable range",(allocator<char> *)&in1)
    ;
    bVar14 = tcu::ResultCollector::check(&status,bVar14,(string *)&in0);
    std::__cxx11::string::~string((string *)&in0);
    pIVar13 = Environment::lookup<tcu::Matrix<float,3,2>>
                        (&env,(this->m_variables).out0.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                              .m_ptr);
    ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
              (&in0,&highpFmt,pIVar13);
    tcu::Matrix<tcu::Interval,_3,_2>::operator=
              ((Matrix<tcu::Interval,_3,_2> *)&oss,(Matrix<tcu::Interval,_3,_2> *)&in0);
    bVar9 = ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doContains
                      ((IVal *)&oss,
                       (Matrix<float,_3,_2> *)
                       ((long)((outputs.out0.
                                super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data
                       + lVar15));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&in0,"Shader output 0 is outside acceptable range",(allocator<char> *)&in1)
    ;
    bVar9 = tcu::ResultCollector::check(&status,bVar9,(string *)&in0);
    std::__cxx11::string::~string((string *)&in0);
    if (!bVar14 || !bVar9) {
      iVar10 = iVar10 + 1;
      numErrors = iVar10;
      if (iVar10 < 0x65) {
        pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
        in0.m_data.m_data[0].m_data[0]._0_8_ = pTVar6;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
        std::operator<<((ostream *)pdVar2,"Failed");
        std::operator<<((ostream *)pdVar2," sample:\n");
        std::operator<<((ostream *)pdVar2,"\t");
        std::__cxx11::string::string
                  ((string *)&in1,
                   (string *)
                   &((this->m_variables).in0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                    .m_ptr)->m_name);
        pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
        std::operator<<((ostream *)pdVar2,(string *)&in1);
        std::operator<<((ostream *)pdVar2," = ");
        valueToString<tcu::Matrix<float,3,2>>
                  ((string *)&in2,(shaderexecutor *)&highpFmt,
                   (FloatFormat *)
                   ((long)((inputs.in0.
                            super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar15),(Matrix<float,_3,_2> *)pIVar12);
        pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
        std::operator<<((ostream *)pdVar2,(string *)&in2);
        std::operator<<((ostream *)pdVar2,"\n");
        std::__cxx11::string::~string((string *)&in2);
        std::__cxx11::string::~string((string *)&in1);
        std::operator<<((ostream *)pdVar2,"\t");
        std::__cxx11::string::string
                  ((string *)&in1,
                   (string *)
                   &((this->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                    .m_ptr)->m_name);
        pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
        std::operator<<((ostream *)pdVar2,(string *)&in1);
        std::operator<<((ostream *)pdVar2," = ");
        valueToString<tcu::Matrix<float,3,2>>
                  ((string *)&in2,(shaderexecutor *)&highpFmt,
                   (FloatFormat *)
                   ((long)((outputs.out0.
                            super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar15),(Matrix<float,_3,_2> *)pIVar12);
        pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
        std::operator<<((ostream *)pdVar2,(string *)&in2);
        std::operator<<((ostream *)pdVar2,"\n");
        std::operator<<((ostream *)pdVar2,"\tExpected range: ");
        intervalToString<tcu::Matrix<float,3,2>>
                  ((string *)&in3,(shaderexecutor *)&highpFmt,(FloatFormat *)&oss,pIVar12);
        pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
        std::operator<<((ostream *)pdVar2,(string *)&in3);
        std::operator<<((ostream *)pdVar2,"\n");
        std::__cxx11::string::~string((string *)&in3);
        std::__cxx11::string::~string((string *)&in2);
        std::__cxx11::string::~string((string *)&in1);
        std::operator<<((ostream *)pdVar2,"\t");
        std::__cxx11::string::string
                  ((string *)&in1,
                   (string *)
                   &((this->m_variables).out1.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_2>_>_>
                    .m_ptr)->m_name);
        pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
        std::operator<<((ostream *)pdVar2,(string *)&in1);
        std::operator<<((ostream *)pdVar2," = ");
        valueToString<tcu::Matrix<float,3,2>>
                  ((string *)&in2,(shaderexecutor *)&highpFmt,
                   (FloatFormat *)
                   ((long)((outputs.out1.
                            super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar15),(Matrix<float,_3,_2> *)pIVar12);
        pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
        std::operator<<((ostream *)pdVar2,(string *)&in2);
        std::operator<<((ostream *)pdVar2,"\n");
        std::operator<<((ostream *)pdVar2,"\tExpected range: ");
        intervalToString<tcu::Matrix<float,3,2>>
                  ((string *)&in3,(shaderexecutor *)&highpFmt,(FloatFormat *)&funcs,pIVar12);
        pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
        std::operator<<((ostream *)pdVar2,(string *)&in3);
        std::operator<<((ostream *)pdVar2,"\n");
        std::__cxx11::string::~string((string *)&in3);
        std::__cxx11::string::~string((string *)&in2);
        std::__cxx11::string::~string((string *)&in1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
      }
    }
    lVar15 = lVar15 + 0x18;
  }
  if (iVar10 < 0x65) {
    if (iVar10 == 0) {
      pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
      in0.m_data.m_data[0].m_data[0]._0_8_ = pTVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
      std::operator<<((ostream *)pdVar2,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
      std::operator<<((ostream *)pdVar2," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&in0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&in0,"Pass",(allocator<char> *)&oss);
      __return_storage_ptr___00 = local_608;
      tcu::TestStatus::pass(local_608,(string *)&in0);
      this_02 = (ostringstream *)&in0;
      goto LAB_007fe818;
    }
  }
  else {
    pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
    in0.m_data.m_data[0].m_data[0]._0_8_ = pTVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,"(Skipped ");
    std::ostream::operator<<(pdVar2,iVar10 + -100);
    std::operator<<((ostream *)pdVar2," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&in0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  }
  pdVar2 = &in0.m_data.m_data[0].m_data[0].m_lo;
  in0.m_data.m_data[0].m_data[0]._0_8_ = pTVar6;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::ostream::operator<<(pdVar2,iVar10);
  std::operator<<((ostream *)pdVar2,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
  std::operator<<((ostream *)pdVar2," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  de::toString<int>((string *)&oss,&numErrors);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs," test failed. Check log for the details",(allocator<char> *)&in1);
  __return_storage_ptr___00 = local_608;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&in0);
  std::__cxx11::string::~string((string *)&in0);
  std::__cxx11::string::~string((string *)&funcs);
  this_02 = &oss;
LAB_007fe818:
  std::__cxx11::string::~string((string *)this_02);
  tcu::ResultCollector::~ResultCollector(&status);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
               *)&env);
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>::
  ~Outputs(&outputs);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs(&inputs);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}